

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test7::getCodeOfFragmentShaderWithDoublePrecisionOutput_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,
          _variable_type output_variable_type,uint array_size)

{
  ostream *poVar1;
  _variable_type type;
  string local_528 [32];
  string local_508 [32];
  undefined1 local_4e8 [8];
  string output_variable_type_string;
  stringstream result_sstream;
  ostream local_4b8;
  stringstream local_330 [8];
  stringstream array_size_sstream;
  ostream local_320;
  stringstream local_1a8 [8];
  stringstream array_index_sstream;
  ostream local_198;
  uint local_20;
  _variable_type local_1c;
  uint array_size_local;
  _variable_type output_variable_type_local;
  GPUShaderFP64Test7 *this_local;
  
  local_20 = array_size;
  local_1c = output_variable_type;
  _array_size_local = this;
  this_local = (GPUShaderFP64Test7 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_330);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(output_variable_type_string.field_2._M_local_buf + 8));
  Utils::getVariableTypeString_abi_cxx11_((string *)local_4e8,(Utils *)(ulong)local_1c,type);
  if (1 < local_20) {
    std::operator<<(&local_198,"[0]");
    poVar1 = std::operator<<(&local_320,"[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::operator<<(poVar1,"]");
  }
  poVar1 = std::operator<<(&local_4b8,"#version 400\n\nout ");
  poVar1 = std::operator<<(poVar1,(string *)local_4e8);
  poVar1 = std::operator<<(poVar1," test_output");
  std::__cxx11::stringstream::str();
  poVar1 = std::operator<<(poVar1,local_508);
  poVar1 = std::operator<<(poVar1,";\n\nvoid main()\n{\n    test_output");
  std::__cxx11::stringstream::str();
  poVar1 = std::operator<<(poVar1,local_528);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,(string *)local_4e8);
  std::operator<<(poVar1,"(2.0);\n}\n");
  std::__cxx11::string::~string(local_528);
  std::__cxx11::string::~string(local_508);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)local_4e8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(output_variable_type_string.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getCodeOfFragmentShaderWithDoublePrecisionOutput(
	Utils::_variable_type output_variable_type, unsigned int array_size)
{
	std::stringstream array_index_sstream;
	std::stringstream array_size_sstream;
	std::stringstream result_sstream;
	std::string		  output_variable_type_string = Utils::getVariableTypeString(output_variable_type);

	if (array_size > 1)
	{
		array_index_sstream << "[0]";
		array_size_sstream << "[" << array_size << "]";
	}

	result_sstream << "#version 400\n"
					  "\n"
					  "out "
				   << output_variable_type_string << " test_output" << array_size_sstream.str() << ";\n"
																								   "\n"
																								   "void main()\n"
																								   "{\n"
																								   "    test_output"
				   << array_index_sstream.str() << " = " << output_variable_type_string << "(2.0);\n"
																						   "}\n";

	return result_sstream.str();
}